

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readValue(OurReader *this)

{
  size_type sVar1;
  ulong uVar2;
  Value *pVVar3;
  double dVar4;
  allocator local_1c9;
  String local_1c8;
  undefined1 local_1a8 [8];
  Value v_6;
  Value v_5;
  Value v_4;
  Value v_3;
  Value v_2;
  Value v_1;
  Value v;
  bool local_69;
  undefined1 local_68 [7];
  bool successful;
  Token token;
  allocator local_39;
  String local_38;
  OurReader *local_18;
  OurReader *this_local;
  
  local_18 = this;
  sVar1 = std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
          size(&this->nodes_);
  if ((this->features_).stackLimit_ < sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"Exceeded stackLimit in readValue().",&local_39);
    throwRuntimeError(&local_38);
  }
  readTokenSkippingComments(this,(Token *)local_68);
  local_69 = true;
  if (((this->collectComments_ & 1U) != 0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    pVVar3 = currentValue(this);
    std::__cxx11::string::string((string *)&v.limit_,(string *)&this->commentsBefore_);
    Value::setComment(pVVar3,(String *)&v.limit_,commentBefore);
    std::__cxx11::string::~string((string *)&v.limit_);
    std::__cxx11::string::clear();
  }
  switch(local_68._0_4_) {
  case 1:
    local_69 = readObject(this,(Token *)local_68);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)this->current_ - (long)this->begin_);
    break;
  case 2:
  case 4:
  case 0xd:
    if (((this->features_).allowDroppedNullPlaceholders_ & 1U) == 0) goto switchD_001580ac_default;
    this->current_ = this->current_ + -1;
    Value::Value((Value *)local_1a8,nullValue);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)local_1a8);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,(ptrdiff_t)(this->current_ + ~(ulong)this->begin_));
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)this->current_ - (long)this->begin_);
    Value::~Value((Value *)local_1a8);
    break;
  case 3:
    local_69 = readArray(this,(Token *)local_68);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)this->current_ - (long)this->begin_);
    break;
  case 5:
    local_69 = decodeString(this,(Token *)local_68);
    break;
  case 6:
    local_69 = decodeNumber(this,(Token *)local_68);
    break;
  case 7:
    Value::Value((Value *)&v_1.limit_,true);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)&v_1.limit_);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_1.limit_);
    break;
  case 8:
    Value::Value((Value *)&v_2.limit_,false);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)&v_2.limit_);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_2.limit_);
    break;
  case 9:
    Value::Value((Value *)&v_3.limit_,nullValue);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)&v_3.limit_);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_3.limit_);
    break;
  case 10:
    dVar4 = std::numeric_limits<double>::quiet_NaN();
    Value::Value((Value *)&v_4.limit_,dVar4);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)&v_4.limit_);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_4.limit_);
    break;
  case 0xb:
    dVar4 = std::numeric_limits<double>::infinity();
    Value::Value((Value *)&v_5.limit_,dVar4);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)&v_5.limit_);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_5.limit_);
    break;
  case 0xc:
    dVar4 = std::numeric_limits<double>::infinity();
    Value::Value((Value *)&v_6.limit_,-dVar4);
    pVVar3 = currentValue(this);
    Value::swapPayload(pVVar3,(Value *)&v_6.limit_);
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    Value::~Value((Value *)&v_6.limit_);
    break;
  default:
switchD_001580ac_default:
    pVVar3 = currentValue(this);
    Value::setOffsetStart(pVVar3,token._0_8_ - (long)this->begin_);
    pVVar3 = currentValue(this);
    Value::setOffsetLimit(pVVar3,(long)token.start_ - (long)this->begin_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c8,"Syntax error: value, object or array expected.",&local_1c9);
    this_local._7_1_ = addError(this,&local_1c8,(Token *)local_68,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    goto LAB_001588dd;
  }
  if ((this->collectComments_ & 1U) != 0) {
    this->lastValueEnd_ = this->current_;
    this->lastValueHasAComment_ = false;
    pVVar3 = currentValue(this);
    this->lastValue_ = pVVar3;
  }
  this_local._7_1_ = local_69;
LAB_001588dd:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::readValue() {
  //  To preserve the old behaviour we cast size_t to int.
  if (nodes_.size() > features_.stackLimit_)
    throwRuntimeError("Exceeded stackLimit in readValue().");
  Token token;
  readTokenSkippingComments(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_.clear();
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue: {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenFalse: {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNull: {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNaN: {
    Value v(std::numeric_limits<double>::quiet_NaN());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenPosInf: {
    Value v(std::numeric_limits<double>::infinity());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNegInf: {
    Value v(-std::numeric_limits<double>::infinity());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // else, fall through ...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValueHasAComment_ = false;
    lastValue_ = &currentValue();
  }

  return successful;
}